

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3DatabasePageSize(int *pRc,Fts3Table *p)

{
  int iVar1;
  sqlite3_stmt *local_30;
  sqlite3_stmt *pStmt;
  char *zSql;
  Fts3Table *pFStack_18;
  int rc;
  Fts3Table *p_local;
  int *pRc_local;
  
  if (*pRc == 0) {
    pFStack_18 = p;
    p_local = (Fts3Table *)pRc;
    pStmt = (sqlite3_stmt *)sqlite3_mprintf("PRAGMA %Q.page_size",p->zDb);
    if (pStmt == (sqlite3_stmt *)0x0) {
      zSql._4_4_ = 7;
    }
    else {
      zSql._4_4_ = sqlite3_prepare(pFStack_18->db,(char *)pStmt,-1,&local_30,(char **)0x0);
      if (zSql._4_4_ == 0) {
        sqlite3_step(local_30);
        iVar1 = sqlite3_column_int(local_30,0);
        pFStack_18->nPgsz = iVar1;
        zSql._4_4_ = sqlite3_finalize(local_30);
      }
      else if (zSql._4_4_ == 0x17) {
        pFStack_18->nPgsz = 0x400;
        zSql._4_4_ = 0;
      }
    }
    sqlite3_free(pStmt);
    *(int *)&(p_local->base).pModule = zSql._4_4_;
  }
  return;
}

Assistant:

static void fts3DatabasePageSize(int *pRc, Fts3Table *p){
  if( *pRc==SQLITE_OK ){
    int rc;                       /* Return code */
    char *zSql;                   /* SQL text "PRAGMA %Q.page_size" */
    sqlite3_stmt *pStmt;          /* Compiled "PRAGMA %Q.page_size" statement */
  
    zSql = sqlite3_mprintf("PRAGMA %Q.page_size", p->zDb);
    if( !zSql ){
      rc = SQLITE_NOMEM;
    }else{
      rc = sqlite3_prepare(p->db, zSql, -1, &pStmt, 0);
      if( rc==SQLITE_OK ){
        sqlite3_step(pStmt);
        p->nPgsz = sqlite3_column_int(pStmt, 0);
        rc = sqlite3_finalize(pStmt);
      }else if( rc==SQLITE_AUTH ){
        p->nPgsz = 1024;
        rc = SQLITE_OK;
      }
    }
    assert( p->nPgsz>0 || rc!=SQLITE_OK );
    sqlite3_free(zSql);
    *pRc = rc;
  }
}